

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

predictor * __thiscall
Search::predictor::add_to<unsigned_int>
          (predictor *this,v_array<unsigned_int> *A,bool *A_is_ptr,uint a,bool clear_first)

{
  uint **ppuVar1;
  size_t sVar2;
  uint *puVar3;
  uint in_ECX;
  byte *in_RDX;
  v_array<unsigned_int> *in_RSI;
  predictor *in_RDI;
  undefined1 in_R8B;
  size_t new_size;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  v_array<unsigned_int> *in_stack_ffffffffffffffc0;
  v_array<unsigned_int> *A_00;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar4;
  char cVar5;
  
  uVar4 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0) & 0x1ffffff;
  cVar5 = (char)(uVar4 >> 0x18);
  if ((*in_RDX & 1) == 0) {
    if (cVar5 != '\0') {
      v_array<unsigned_int>::clear(in_stack_ffffffffffffffc0);
    }
    v_array<unsigned_int>::push_back
              (in_stack_ffffffffffffffc0,
               (uint *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    if (cVar5 != '\0') {
      ppuVar1 = v_array<unsigned_int>::begin(in_RSI);
      puVar3 = *ppuVar1;
      ppuVar1 = v_array<unsigned_int>::end(in_RSI);
      *ppuVar1 = puVar3;
    }
    if ((uVar4 & 0x1000000) == 0) {
      sVar2 = v_array<unsigned_int>::size(in_RSI);
      A_00 = (v_array<unsigned_int> *)(sVar2 + 1);
    }
    else {
      A_00 = (v_array<unsigned_int> *)0x1;
    }
    make_new_pointer<unsigned_int>((predictor *)CONCAT44(in_ECX,uVar4),A_00,(size_t)in_RDI);
    *in_RDX = 0;
    puVar3 = v_array<unsigned_int>::operator[](in_RSI,(size_t)((long)&A_00[-1].erase_count + 7));
    *puVar3 = in_ECX;
  }
  return in_RDI;
}

Assistant:

predictor& predictor::add_to(v_array<T>& A, bool& A_is_ptr, T a, bool clear_first)
{
  if (A_is_ptr)  // we need to make our own memory
  {
    if (clear_first)
      A.end() = A.begin();
    size_t new_size = clear_first ? 1 : (A.size() + 1);
    make_new_pointer<T>(A, new_size);
    A_is_ptr = false;
    A[new_size - 1] = a;
  }
  else  // we've already allocated our own memory
  {
    if (clear_first)
      A.clear();
    A.push_back(a);
  }
  return *this;
}